

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O2

void CorUnix::InternalDeleteArray<CorUnix::ISynchWaitController*>(ISynchWaitController **p)

{
  if (p != (ISynchWaitController **)0x0) {
    InternalFree(p + -1);
    return;
  }
  return;
}

Assistant:

void InternalDeleteArray(T *p)
    {
        if (p)
        {
            size_t *pRealMem = (size_t*)p - 1;
            size_t cElements = *pRealMem;
            for (size_t i = 0; i < cElements; i++)
                p[i].~T();
            InternalFree(pRealMem);
        }
    }